

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::loadSkeleton(Application *this,char *filename,Scene *scene)

{
  _Rb_tree_header *p_Var1;
  Skeleton *this_00;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  undefined8 *puVar8;
  string filenameNoExt;
  set<double,_std::less<double>,_std::allocator<double>_> knotTimes;
  stringstream loadfilename;
  long *local_228;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  local_1e8;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,filename,(allocator<char> *)local_1b8);
  std::__cxx11::string::find((char *)&local_208,0x1df311,0);
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_208);
  std::__cxx11::string::operator=((string *)&local_208,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  p_Var7 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    iVar3 = 0;
    do {
      if (*(long *)(p_Var7 + 1) == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = __dynamic_cast(*(long *)(p_Var7 + 1),&DynamicScene::SceneObject::typeinfo,
                               &DynamicScene::Mesh::typeinfo,0);
      }
      if (lVar4 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_skel.xml",9);
        this_00 = *(Skeleton **)(lVar4 + 0x168);
        std::__cxx11::stringbuf::str();
        DynamicScene::Skeleton::load
                  ((set<double,_std::less<double>,_std::allocator<double>_> *)&local_1e8,this_00,
                   (char *)local_228);
        if (local_228 != local_218) {
          operator_delete(local_228,local_218[0] + 1);
        }
        puVar2 = *(undefined8 **)(*(long *)(lVar4 + 0x168) + 0x108);
        for (puVar8 = *(undefined8 **)(*(long *)(lVar4 + 0x168) + 0x100); puVar8 != puVar2;
            puVar8 = puVar8 + 1) {
          DynamicScene::Scene::addObject(scene,(SceneObject *)*puVar8);
        }
        for (p_Var6 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_1e8._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          Timeline::markTime(&this->timeline,(int)*(double *)(p_Var6 + 1));
        }
        iVar3 = iVar3 + 1;
        std::
        _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
        ::~_Rb_tree(&local_1e8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  return;
}

Assistant:

void CMU462::Application::loadSkeleton(const char * filename, DynamicScene::Scene * scene)
{
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects)
  {
    DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>(object);
    if (mesh)
    {
      stringstream loadfilename;
      loadfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      set<double> knotTimes = mesh->skeleton->load(loadfilename.str().c_str());
      // Add all joints to the scene
      for (auto joint : mesh->skeleton->joints)
      {
        scene->addObject(joint);
      }
      // Mark all knots on the timeline
      for (auto knotTime : knotTimes)
      {
        timeline.markTime(knotTime);
      }
      meshID++;
    }
  }
}